

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t parse_digest(archive_read *a,archive_entry *entry,char *digest,wchar_t type)

{
  ulong uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  size_t sVar4;
  char *fmt;
  ulong uVar5;
  uchar digest_buf [64];
  
  uVar1 = *(ulong *)(&DAT_001794d8 + (long)type * 8);
  sVar4 = strnlen(digest,uVar1 | 1);
  if (sVar4 == uVar1) {
    for (uVar5 = 0; uVar1 >> 1 != uVar5; uVar5 = uVar5 + 1) {
      wVar2 = parse_hex_nibble(digest[uVar5 * 2]);
      wVar3 = parse_hex_nibble(digest[uVar5 * 2 + 1]);
      if ((wVar2 == L'\xffffffff') || (wVar3 == L'\xffffffff')) {
        fmt = "invalid digest data, ignoring";
        goto LAB_0012a425;
      }
      digest_buf[uVar5] = (byte)wVar3 | (byte)(wVar2 << 4);
    }
    wVar2 = archive_entry_set_digest(entry,type,digest_buf);
  }
  else {
    fmt = "incorrect digest length, ignoring";
LAB_0012a425:
    archive_set_error(&a->archive,0x54,fmt);
    wVar2 = L'\xffffffec';
  }
  return wVar2;
}

Assistant:

static int
parse_digest(struct archive_read *a, struct archive_entry *entry,
    const char *digest, int type)
{
	unsigned char digest_buf[64];
	int high, low;
	size_t i, j, len;

	switch (type) {
	case ARCHIVE_ENTRY_DIGEST_MD5:
		len = sizeof(entry->digest.md5);
		break;
	case ARCHIVE_ENTRY_DIGEST_RMD160:
		len = sizeof(entry->digest.rmd160);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA1:
		len = sizeof(entry->digest.sha1);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA256:
		len = sizeof(entry->digest.sha256);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA384:
		len = sizeof(entry->digest.sha384);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA512:
		len = sizeof(entry->digest.sha512);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			"Internal error: Unknown digest type");
		return ARCHIVE_FATAL;
	}

	if (len > sizeof(digest_buf)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			"Internal error: Digest storage too large");
		return ARCHIVE_FATAL;
	}

	len *= 2;

	if (mtree_strnlen(digest, len+1) != len) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "incorrect digest length, ignoring");
		return ARCHIVE_WARN;
	}

	for (i = 0, j = 0; i < len; i += 2, j++) {
		high = parse_hex_nibble(digest[i]);
		low = parse_hex_nibble(digest[i+1]);
		if (high == -1 || low == -1) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
					  "invalid digest data, ignoring");
			return ARCHIVE_WARN;
		}

		digest_buf[j] = high << 4 | low;
	}

	return archive_entry_set_digest(entry, type, digest_buf);
}